

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O2

void __thiscall cmCTestGlobalVC::~cmCTestGlobalVC(cmCTestGlobalVC *this)

{
  (this->super_cmCTestVC)._vptr_cmCTestVC = (_func_int **)&PTR__cmCTestGlobalVC_00a0eef0;
  std::__cxx11::_List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::_M_clear
            (&(this->Revisions).
              super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>);
  cmCTestVC::Revision::~Revision(&this->PriorRev);
  std::__cxx11::string::~string((string *)&this->NewRevision);
  std::__cxx11::string::~string((string *)&this->OldRevision);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
  ::~_Rb_tree(&(this->Dirs)._M_t);
  cmCTestVC::~cmCTestVC(&this->super_cmCTestVC);
  return;
}

Assistant:

cmCTestGlobalVC::~cmCTestGlobalVC() = default;